

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

pair<pstore::index::details::index_pointer,_bool> __thiscall
pstore::index::
hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
::insert_node<std::pair<std::__cxx11::string,pstore::extent<char>>>
          (hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
           *this,transaction_base *transaction,index_pointer node,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>
          *value,hash_type hash,uint shifts,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents,
          bool is_upsert)

{
  database *db;
  undefined1 auVar1 [12];
  __type_conflict _Var2;
  address addr;
  index_pointer iVar3;
  size_t sVar4;
  undefined7 uVar6;
  ulong uVar5;
  pair<pstore::index::details::index_pointer,_bool> pVar7;
  index_pointer node_local;
  hash_type local_68;
  key_type existing_key;
  index_pointer local_40;
  undefined8 local_38;
  
  node_local = node;
  if (((ulong)node.internal_ & 1) == 0) {
    db = transaction->db_;
    local_68 = hash;
    addr = details::index_pointer::to_address((index_pointer *)&node_local.addr_);
    hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::get_key(&existing_key,
              (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this,db,addr);
    _Var2 = std::operator==(&value->first,&existing_key);
    if (_Var2) {
      uVar6 = (undefined7)((ulong)this >> 8);
      if (is_upsert) {
        iVar3.addr_ = store_leaf_node<std::pair<std::__cxx11::string,pstore::extent<char>>>
                                (this,transaction,value,parents);
        uVar5 = CONCAT71(uVar6,1);
      }
      else {
        local_40 = node_local;
        local_38 = 0xffffffffffffffff;
        array_stack<pstore::index::details::parent_type,_13UL>::push
                  (parents.ptr_,(value_type *)&local_40.addr_);
        uVar5 = CONCAT71(uVar6,1);
        iVar3 = node_local;
      }
    }
    else {
      sVar4 = std::
              hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(this + 0x28),&existing_key);
      iVar3 = insert_into_leaf<std::pair<std::__cxx11::string,pstore::extent<char>>>
                        (this,transaction,&node_local,value,sVar4 >> ((byte)shifts & 0x3f),local_68,
                         shifts,parents);
      uVar5 = 0;
    }
    std::__cxx11::string::~string((string *)&existing_key);
  }
  else {
    if (shifts < 0x42) {
      pVar7 = insert_into_internal<std::pair<std::__cxx11::string,pstore::extent<char>>>
                        (this,transaction,node,value,hash,shifts,parents,is_upsert);
      auVar1 = pVar7._0_12_;
    }
    else {
      pVar7 = insert_into_linear<std::pair<std::__cxx11::string,pstore::extent<char>>>
                        (this,transaction,node,value,parents,is_upsert);
      auVar1 = pVar7._0_12_;
    }
    iVar3 = auVar1._0_8_;
    uVar5 = (ulong)auVar1._8_4_;
  }
  pVar7._8_8_ = uVar5 & 0xffffffff;
  pVar7.first.internal_ = iVar3.internal_;
  return pVar7;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::insert_node (
            transaction_base & transaction, index_pointer const node, OtherValueType const & value,
            hash_type hash, unsigned shifts, gsl::not_null<parent_stack *> parents, bool is_upsert)
            -> std::pair<index_pointer, bool> {

            index_pointer result;
            bool key_exists = false;
            if (node.is_leaf ()) { // This node is a leaf node.
                key_type const existing_key =
                    get_key (transaction.db (), node.to_address ()); // Read key.
                if (equal_ (value.first, existing_key)) {
                    if (is_upsert) {
                        result = this->store_leaf_node (transaction, value, parents);
                    } else {
                        parents->push (details::parent_type{node});
                        result = node;
                    }
                    key_exists = true;
                } else {
                    auto const existing_hash =
                        static_cast<hash_type> ((hash_ (existing_key) >> shifts));
                    result = this->insert_into_leaf (transaction, node, value, existing_hash, hash,
                                                     shifts, parents);
                }
            } else {
                // This node is an internal or a linear node.
                if (details::depth_is_internal_node (shifts)) {
                    std::tie (result, key_exists) = this->insert_into_internal (
                        transaction, node, value, hash, shifts, parents, is_upsert);
                } else {
                    std::tie (result, key_exists) =
                        this->insert_into_linear (transaction, node, value, parents, is_upsert);
                }
            }

            return std::make_pair (result, key_exists);
        }